

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.h
# Opt level: O1

void __thiscall
Clasp::Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::AddReasonLit>
          (PrgDepGraph *this,BodyNode *n,AddReasonLit *p)

{
  uint uVar1;
  ulong uVar2;
  NodeId id;
  Literal p_00;
  uint *puVar3;
  ulong uVar4;
  
  puVar3 = (n->super_Node).sep_;
  uVar1 = *puVar3;
  uVar4 = (ulong)(2 - (((n->super_Node).field_0x7 & 0x20) == 0));
  if (uVar1 == 0xffffffff) {
    id = 0;
  }
  else {
    id = 0;
    do {
      DefaultUnfoundedCheck::AddReasonLit::operator()
                (p,(Literal)(this->atoms_).ebo_.buf[uVar1].super_Node.lit.rep_,id,false);
      id = id + 1;
      uVar1 = puVar3[uVar4];
      puVar3 = puVar3 + uVar4;
    } while (uVar1 != 0xffffffff);
  }
  uVar2 = (ulong)(*(uint *)&(n->super_Node).field_0x4 >> 0x1c & 1);
  p_00.rep_ = puVar3[uVar2];
  if (p_00.rep_ != 0xffffffff) {
    puVar3 = puVar3 + uVar4 + uVar2;
    do {
      DefaultUnfoundedCheck::AddReasonLit::operator()(p,p_00,id,true);
      id = id + 1;
      p_00.rep_ = *puVar3;
      puVar3 = puVar3 + uVar4;
    } while (p_00.rep_ != 0xffffffff);
  }
  return;
}

Assistant:

void visitBodyLiterals(const BodyNode& n, const P& p) const {
		const NodeId*  x = n.preds();
		const uint32 inc = n.pred_inc();
		uint32         i = 0;
		for (; *x != idMax; x += inc, ++i) { p(getAtom(*x).lit, i, false); }
		x += n.extended();
		for (; *x != idMax; x += inc, ++i) { p(Literal::fromRep(*x), i, true); }
	}